

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cc
# Opt level: O3

void __thiscall DisplayNCurses::render(DisplayNCurses *this,SatLookAngles *sats)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppVar2;
  pointer pcVar3;
  char *__s;
  long *plVar4;
  bool bVar5;
  bool bVar6;
  ostream *poVar7;
  char cVar8;
  char cVar9;
  int iVar10;
  ulong *puVar11;
  WINDOW *win;
  size_t sVar12;
  uint uVar13;
  undefined8 uVar14;
  long lVar15;
  ulong uVar16;
  pointer ppVar17;
  SatLookAngles *sats_00;
  long lVar18;
  long *plVar19;
  uint uVar20;
  ulong uVar21;
  array<std::pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_12UL>
  fields;
  string __str_2;
  string colNames;
  string __str_1;
  stringstream ss;
  undefined1 *local_700;
  undefined8 local_6f8;
  undefined1 local_6f0;
  undefined7 uStack_6ef;
  undefined8 uStack_6e8;
  ulong *local_6e0;
  ITEM **local_6d8;
  char **local_6d0;
  char **local_6c8;
  char **local_6c0;
  char **local_6b8;
  char **local_6b0;
  char **local_6a8;
  char **local_6a0;
  undefined8 local_698;
  MENU *local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  string local_5a8;
  SatLookAngles *local_588;
  long *local_580;
  ostream *local_578;
  long local_570;
  undefined8 local_568;
  undefined4 uStack_560;
  undefined4 uStack_55c;
  char *local_558;
  undefined1 *local_550;
  undefined8 local_548;
  undefined8 local_540;
  undefined8 uStack_538;
  char *local_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_528;
  size_type local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  char *local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_500;
  size_type local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  char *local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4d8;
  size_type local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c8;
  char *local_4b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4b0;
  size_type local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a0;
  char *local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_488;
  size_type local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  char *local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_460;
  size_type local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  char *local_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_438;
  size_type local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  char *local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_410;
  size_type local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  char *local_3f0;
  char *local_3e8;
  char local_3d8 [8];
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined1 *local_3c0;
  undefined8 local_3b8;
  long local_3b0 [2];
  undefined8 local_3a0;
  ulong local_398;
  string *local_390;
  char *local_388;
  uint local_380;
  char local_378 [8];
  undefined8 uStack_370;
  DateTime local_368;
  long *local_360;
  long local_350 [2];
  ostream *local_340;
  long local_338;
  uint local_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  long alStack_320 [12];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  ppVar17 = (sats->_sats).
            super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppVar2 = (sats->_sats).
           super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar15 = (long)ppVar17 - (long)ppVar2 >> 3;
  uVar16 = lVar15 * -0x1084210842108421;
  uVar21 = -(ulong)(uVar16 + 1 >> 0x3d != 0) | lVar15 * 0x7bdef7bdef7bdef8 + 8U;
  local_588 = sats;
  local_6d8 = (ITEM **)operator_new__(uVar21);
  memset(local_6d8,0,uVar21);
  uVar21 = lVar15 * -0x1084210842108420;
  local_6e0 = (ulong *)operator_new__(-(ulong)(uVar16 >> 0x3b != 0) | uVar21 | 8);
  *local_6e0 = uVar16;
  if (ppVar17 != ppVar2) {
    puVar11 = local_6e0 + 3;
    do {
      puVar11[-2] = (ulong)puVar11;
      puVar11[-1] = 0;
      *(undefined1 *)puVar11 = 0;
      puVar11 = puVar11 + 4;
      uVar21 = uVar21 - 0x20;
    } while (uVar21 != 0);
  }
  local_6d8[lVar15 * 0xf7bdef7bdef7bdf] = (ITEM *)0x0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ID",2);
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0x19;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"NAME",4);
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xf;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"AZIMUTH(deg)",0xc);
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xf;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ELEVATION(deg)",0xe);
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 0xc;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"RANGE(KM)",9);
  std::__cxx11::stringbuf::str();
  uVar20 = 0x19;
  if (0x19 < (int)_LINES) {
    uVar20 = _LINES;
  }
  uVar13 = 0x50;
  if (0x50 < (int)_COLS) {
    uVar13 = _COLS;
  }
  win = (WINDOW *)newwin(uVar20,uVar13,0,0);
  sats_00 = local_588;
  box(win,0x7c,0x3d);
  lVar15 = newwin(0x14,0x4f,(uVar20 >> 1) - 0xc,(uVar13 >> 1) - 0x27);
  wattr_on(lVar15,0x40000,0);
  box(lVar15,0x7c,0x2d);
  wattr_off(lVar15,0x40000,0);
  local_698 = new_panel(lVar15);
  local_3a0 = new_panel();
  local_390 = (string *)(local_6e0 + 1);
  local_690 = updateMenu((MENU *)0x0,win,sats_00,local_6d8,local_390,false);
  mvwprintw(win,0,(uVar13 >> 1) - 0xc,"%s","}-- satnow 0.1.0 --{");
  mvwprintw(win,1,3,"%s",local_360);
  iVar10 = wmove(win,uVar20 - 3,1);
  if (iVar10 != -1) {
    whline(win,0x2d,uVar13 - 2);
  }
  mvwprintw(win,uVar20 - 2,1,"%s",
            "[Quit: (q)] [Update: (space)] [Movement: (pg)up/(pg)down] [Details: (d)]");
  update_panels();
  doupdate();
  iVar10 = -1;
  if (-1 < this->_refreshSecs) {
    iVar10 = this->_refreshSecs;
  }
  wtimeout(_stdscr,iVar10);
  local_6a0 = &local_508;
  local_6a8 = &local_4e0;
  local_6b0 = &local_4b8;
  local_6b8 = &local_490;
  local_6c0 = &local_468;
  local_6c8 = &local_440;
  local_6d0 = &local_418;
  bVar6 = false;
  do {
    iVar10 = wgetch(_stdscr);
    if (iVar10 < 0x102) {
      if (iVar10 < 100) {
        if ((iVar10 == -1) || (iVar10 == 0x20)) {
          updateMenu(local_690,win,sats_00,local_6d8,local_390,true);
          refresh();
        }
      }
      else if (iVar10 == 100) {
        if (bVar6) {
          hide_panel(local_698);
          bVar6 = (bool)(~bVar6 & 1);
        }
        else {
          uVar14 = current_item(local_690);
          iVar10 = item_index(uVar14);
          uVar16 = (ulong)iVar10;
          ppVar17 = (sats_00->_sats).
                    super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar21 = ((long)(sats_00->_sats).
                          super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar17 >> 3) *
                   -0x1084210842108421;
          if (uVar21 < uVar16 || uVar21 - uVar16 == 0) {
            __assert_fail("index < size() && \"Invalid index.\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/enferex[P]satnow/main.hh"
                          ,0x51,"SatLookAngle &SatLookAngles::operator[](size_t)");
          }
          local_580 = &local_570;
          lVar18 = *(long *)&ppVar17[uVar16].first.name_._M_dataplus;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_580,lVar18,
                     ppVar17[uVar16].first.name_._M_string_length + lVar18);
          poVar7 = local_578;
          if (local_580 != &local_570) {
            operator_delete(local_580,local_570 + 1);
          }
          ppVar17 = ppVar17 + uVar16;
          if (poVar7 == (ostream *)0x0) {
            uVar20 = (ppVar17->first).norad_number_;
            cVar9 = '\x01';
            if (9 < uVar20) {
              uVar13 = uVar20;
              cVar8 = '\x04';
              do {
                cVar9 = cVar8;
                if (uVar13 < 100) {
                  cVar9 = cVar9 + -2;
                  goto LAB_0010cd8c;
                }
                if (uVar13 < 1000) {
                  cVar9 = cVar9 + -1;
                  goto LAB_0010cd8c;
                }
                if (uVar13 < 10000) goto LAB_0010cd8c;
                bVar5 = 99999 < uVar13;
                uVar13 = uVar13 / 10000;
                cVar8 = cVar9 + '\x04';
              } while (bVar5);
              cVar9 = cVar9 + '\x01';
            }
LAB_0010cd8c:
            local_580 = &local_570;
            std::__cxx11::string::_M_construct((ulong)&local_580,cVar9);
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((char *)local_580,(uint)local_578,uVar20);
            mvwprintw(lVar15,1,1,"Name : %s (NORAD ID)",local_580);
          }
          else {
            local_580 = &local_570;
            lVar18 = *(long *)&(ppVar17->first).name_._M_dataplus;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_580,lVar18,(ppVar17->first).name_._M_string_length + lVar18)
            ;
            mvwprintw(lVar15,1,1,"Name : %s",local_580);
          }
          if (local_580 != &local_570) {
            operator_delete(local_580,local_570 + 1);
          }
          local_580 = &local_570;
          pcVar3 = (ppVar17->first).line_one_._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_580,pcVar3,
                     pcVar3 + (ppVar17->first).line_one_._M_string_length);
          mvwprintw(lVar15,2,1,"Line1: %s",local_580);
          if (local_580 != &local_570) {
            operator_delete(local_580,local_570 + 1);
          }
          local_580 = &local_570;
          pcVar3 = (ppVar17->first).line_two_._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_580,pcVar3,
                     pcVar3 + (ppVar17->first).line_two_._M_string_length);
          mvwprintw(lVar15,3,1,"Line2: %s",local_580);
          if (local_580 != &local_570) {
            operator_delete(local_580,local_570 + 1);
          }
          if (lVar15 == 0) {
            uVar16 = 0xffffffff;
          }
          else {
            uVar16 = (ulong)((int)*(short *)(lVar15 + 6) + 1);
          }
          iVar10 = wmove(lVar15,4,1);
          if (iVar10 != -1) {
            whline(lVar15,0x2d,(int)uVar16 + -2);
          }
          uVar20 = (ppVar17->first).norad_number_;
          cVar9 = '\x01';
          paVar1 = &local_5a8.field_2;
          if (9 < uVar20) {
            uVar13 = uVar20;
            cVar8 = '\x04';
            do {
              cVar9 = cVar8;
              if (uVar13 < 100) {
                cVar9 = cVar9 + -2;
                goto LAB_0010cfa1;
              }
              if (uVar13 < 1000) {
                cVar9 = cVar9 + -1;
                goto LAB_0010cfa1;
              }
              if (uVar13 < 10000) goto LAB_0010cfa1;
              bVar5 = 99999 < uVar13;
              uVar13 = uVar13 / 10000;
              cVar8 = cVar9 + '\x04';
            } while (bVar5);
            cVar9 = cVar9 + '\x01';
          }
LAB_0010cfa1:
          local_398 = uVar16;
          local_340 = (ostream *)&local_330;
          std::__cxx11::string::_M_construct((ulong)&local_340,cVar9);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_340,(uint)local_338,uVar20);
          local_580 = (long *)0x115c71;
          if (local_340 == (ostream *)&local_330) {
            uStack_560 = uStack_328;
            uStack_55c = uStack_324;
            local_578 = (ostream *)&local_568;
          }
          else {
            local_578 = local_340;
          }
          local_568 = CONCAT44(uStack_32c,local_330);
          local_570 = local_338;
          local_338 = 0;
          local_330 = local_330 & 0xffffff00;
          pcVar3 = (ppVar17->first).int_designator_._M_dataplus._M_p;
          local_700 = &local_6f0;
          local_340 = (ostream *)&local_330;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_700,pcVar3,
                     pcVar3 + (ppVar17->first).int_designator_._M_string_length);
          local_558 = "Designator";
          if (local_700 == &local_6f0) {
            uStack_538 = uStack_6e8;
            local_550 = (undefined1 *)&local_540;
          }
          else {
            local_550 = local_700;
          }
          local_540 = CONCAT71(uStack_6ef,local_6f0);
          local_548 = local_6f8;
          local_6f8 = 0;
          local_6f0 = 0;
          local_368.m_encoded = (ppVar17->first).epoch_.m_encoded;
          local_700 = &local_6f0;
          DateTime::ToString_abi_cxx11_(&local_5a8,&local_368);
          local_530 = "Epoch";
          local_528 = &local_518;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a8._M_dataplus._M_p == paVar1) {
            local_518._8_8_ = local_5a8.field_2._8_8_;
          }
          else {
            local_528 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5a8._M_dataplus._M_p;
          }
          local_518._M_allocated_capacity._1_7_ = local_5a8.field_2._M_allocated_capacity._1_7_;
          local_518._M_local_buf[0] = local_5a8.field_2._M_local_buf[0];
          local_520 = local_5a8._M_string_length;
          local_5a8._M_string_length = 0;
          local_5a8.field_2._M_local_buf[0] = '\0';
          local_5a8._M_dataplus._M_p = (pointer)paVar1;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_688,vsnprintf,0x148,"%f",SUB84((ppVar17->first).bstar_,0));
          local_508 = "BSTAR(drag term)";
          local_500 = &local_4f0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_688._M_dataplus._M_p == &local_688.field_2) {
            local_4f0._8_8_ = local_688.field_2._8_8_;
          }
          else {
            local_500 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_688._M_dataplus._M_p;
          }
          local_4f0._M_allocated_capacity._1_7_ = local_688.field_2._M_allocated_capacity._1_7_;
          local_4f0._M_local_buf[0] = local_688.field_2._M_local_buf[0];
          local_4f8 = local_688._M_string_length;
          local_688._M_string_length = 0;
          local_688.field_2._M_local_buf[0] = '\0';
          local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_668,vsnprintf,0x148,"%f",SUB84((ppVar17->first).inclination_,0));
          local_4e0 = "Inclination(deg)";
          local_4d8 = &local_4c8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_668._M_dataplus._M_p == &local_668.field_2) {
            local_4c8._8_8_ = local_668.field_2._8_8_;
          }
          else {
            local_4d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_668._M_dataplus._M_p;
          }
          local_4c8._M_allocated_capacity._1_7_ = local_668.field_2._M_allocated_capacity._1_7_;
          local_4c8._M_local_buf[0] = local_668.field_2._M_local_buf[0];
          local_4d0 = local_668._M_string_length;
          local_668._M_string_length = 0;
          local_668.field_2._M_local_buf[0] = '\0';
          local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_5c8,vsnprintf,0x148,"%f",SUB84((ppVar17->first).right_ascending_node_,0)
                    );
          local_4b8 = "RightAscention(deg)";
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5c8._M_dataplus._M_p == &local_5c8.field_2) {
            local_4a0._8_8_ = local_5c8.field_2._8_8_;
            local_4b0 = &local_4a0;
          }
          else {
            local_4b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5c8._M_dataplus._M_p;
          }
          local_4a0._M_allocated_capacity._1_7_ = local_5c8.field_2._M_allocated_capacity._1_7_;
          local_4a0._M_local_buf[0] = local_5c8.field_2._M_local_buf[0];
          local_4a8 = local_5c8._M_string_length;
          local_5c8._M_string_length = 0;
          local_5c8.field_2._M_local_buf[0] = '\0';
          local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_5e8,vsnprintf,0x148,"%f",SUB84((ppVar17->first).eccentricity_,0));
          local_490 = "Eccentricity";
          local_488 = &local_478;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5e8._M_dataplus._M_p == &local_5e8.field_2) {
            local_478._8_8_ = local_5e8.field_2._8_8_;
          }
          else {
            local_488 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_5e8._M_dataplus._M_p;
          }
          local_478._M_allocated_capacity._1_7_ = local_5e8.field_2._M_allocated_capacity._1_7_;
          local_478._M_local_buf[0] = local_5e8.field_2._M_local_buf[0];
          local_480 = local_5e8._M_string_length;
          local_5e8._M_string_length = 0;
          local_5e8.field_2._M_local_buf[0] = '\0';
          local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_608,vsnprintf,0x148,"%f",SUB84((ppVar17->first).argument_perigee_,0));
          local_468 = "ArgOfPerigee(deg)";
          local_460 = &local_450;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_608._M_dataplus._M_p == &local_608.field_2) {
            local_450._8_8_ = local_608.field_2._8_8_;
          }
          else {
            local_460 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_608._M_dataplus._M_p;
          }
          local_450._M_allocated_capacity._1_7_ = local_608.field_2._M_allocated_capacity._1_7_;
          local_450._M_local_buf[0] = local_608.field_2._M_local_buf[0];
          local_458 = local_608._M_string_length;
          local_608._M_string_length = 0;
          local_608.field_2._M_local_buf[0] = '\0';
          local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_628,vsnprintf,0x148,"%f",SUB84((ppVar17->first).mean_anomaly_,0));
          local_440 = "MeanAnomaly(deg)";
          local_438 = &local_428;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_628._M_dataplus._M_p == &local_628.field_2) {
            local_428._8_8_ = local_628.field_2._8_8_;
          }
          else {
            local_438 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_628._M_dataplus._M_p;
          }
          local_428._M_allocated_capacity._1_7_ = local_628.field_2._M_allocated_capacity._1_7_;
          local_428._M_local_buf[0] = local_628.field_2._M_local_buf[0];
          local_430 = local_628._M_string_length;
          local_628._M_string_length = 0;
          local_628.field_2._M_local_buf[0] = '\0';
          local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_648,vsnprintf,0x148,"%f",SUB84((ppVar17->first).mean_motion_,0));
          local_418 = "MeanMotion(revs per day)";
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_648._M_dataplus._M_p == &local_648.field_2) {
            local_400._8_8_ = local_648.field_2._8_8_;
            local_410 = &local_400;
          }
          else {
            local_410 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_648._M_dataplus._M_p;
          }
          local_400._M_allocated_capacity._1_7_ = local_648.field_2._M_allocated_capacity._1_7_;
          local_400._M_local_buf[0] = local_648.field_2._M_local_buf[0];
          local_408 = local_648._M_string_length;
          local_648._M_string_length = 0;
          local_648.field_2._M_local_buf[0] = '\0';
          uVar20 = (ppVar17->first).orbit_number_;
          cVar9 = '\x01';
          if (9 < uVar20) {
            uVar13 = uVar20;
            cVar8 = '\x04';
            do {
              cVar9 = cVar8;
              if (uVar13 < 100) {
                cVar9 = cVar9 + -2;
                goto LAB_0010d677;
              }
              if (uVar13 < 1000) {
                cVar9 = cVar9 + -1;
                goto LAB_0010d677;
              }
              if (uVar13 < 10000) goto LAB_0010d677;
              bVar5 = 99999 < uVar13;
              uVar13 = uVar13 / 10000;
              cVar8 = cVar9 + '\x04';
            } while (bVar5);
            cVar9 = cVar9 + '\x01';
          }
LAB_0010d677:
          local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
          local_388 = local_378;
          std::__cxx11::string::_M_construct((ulong)&local_388,cVar9);
          std::__detail::__to_chars_10_impl<unsigned_int>(local_388,local_380,uVar20);
          local_3f0 = "RevolutionNumber";
          local_3e8 = local_3d8;
          if (local_388 == local_378) {
            uStack_3d0 = uStack_370;
          }
          else {
            local_3e8 = local_388;
          }
          local_3c8 = 0;
          local_3c0 = (undefined1 *)local_3b0;
          local_3b8 = 0;
          local_3b0[0]._0_1_ = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_648._M_dataplus._M_p != &local_648.field_2) {
            operator_delete(local_648._M_dataplus._M_p,
                            CONCAT71(local_648.field_2._M_allocated_capacity._1_7_,
                                     local_648.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_628._M_dataplus._M_p != &local_628.field_2) {
            operator_delete(local_628._M_dataplus._M_p,
                            CONCAT71(local_628.field_2._M_allocated_capacity._1_7_,
                                     local_628.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_608._M_dataplus._M_p != &local_608.field_2) {
            operator_delete(local_608._M_dataplus._M_p,
                            CONCAT71(local_608.field_2._M_allocated_capacity._1_7_,
                                     local_608.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
            operator_delete(local_5e8._M_dataplus._M_p,
                            CONCAT71(local_5e8.field_2._M_allocated_capacity._1_7_,
                                     local_5e8.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
            operator_delete(local_5c8._M_dataplus._M_p,
                            CONCAT71(local_5c8.field_2._M_allocated_capacity._1_7_,
                                     local_5c8.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_668._M_dataplus._M_p != &local_668.field_2) {
            operator_delete(local_668._M_dataplus._M_p,
                            CONCAT71(local_668.field_2._M_allocated_capacity._1_7_,
                                     local_668.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_688._M_dataplus._M_p != &local_688.field_2) {
            operator_delete(local_688._M_dataplus._M_p,
                            CONCAT71(local_688.field_2._M_allocated_capacity._1_7_,
                                     local_688.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5a8._M_dataplus._M_p != paVar1) {
            operator_delete(local_5a8._M_dataplus._M_p,
                            CONCAT71(local_5a8.field_2._M_allocated_capacity._1_7_,
                                     local_5a8.field_2._M_local_buf[0]) + 1);
          }
          uVar16 = local_398;
          if (local_700 != &local_6f0) {
            operator_delete(local_700,CONCAT71(uStack_6ef,local_6f0) + 1);
          }
          if (local_340 != (ostream *)&local_330) {
            operator_delete(local_340,CONCAT44(uStack_32c,local_330) + 1);
          }
          iVar10 = 6;
          lVar18 = 0x10;
          do {
            std::__cxx11::stringstream::stringstream((stringstream *)&local_340);
            *(long *)((long)alStack_320 + *(long *)(CONCAT44(uStack_32c,local_330) + -0x18)) =
                 (long)(((int)(((uint)(uVar16 >> 0x1f) & 1) + (int)uVar16) >> 1) + -8);
            __s = *(char **)((long)&local_5a8.field_2 + lVar18 + 8);
            if (__s == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(CONCAT44(uStack_32c,local_330) + -0x18) +
                              (int)(ostream *)&local_330);
            }
            else {
              sVar12 = strlen(__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,__s,sVar12);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,": ",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_330,*(char **)((long)&local_588 + lVar18),
                       *(long *)((long)&local_580 + lVar18));
            std::__cxx11::stringbuf::str();
            mvwprintw(lVar15,iVar10,1,"%s",local_700);
            if (local_700 != &local_6f0) {
              operator_delete(local_700,CONCAT71(uStack_6ef,local_6f0) + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)&local_340);
            std::ios_base::~ios_base(local_2c0);
            iVar10 = iVar10 + 1;
            lVar18 = lVar18 + 0x28;
          } while (lVar18 != 0x1f0);
          lVar18 = -0x1e0;
          plVar19 = local_3b0;
          do {
            if (plVar19 != (long *)plVar19[-2]) {
              operator_delete((long *)plVar19[-2],*plVar19 + 1);
            }
            plVar19 = plVar19 + -5;
            lVar18 = lVar18 + 0x28;
          } while (lVar18 != 0);
          show_panel(local_698);
          sats_00 = local_588;
          top_panel(local_698);
          bVar6 = (bool)(~bVar6 & 1);
        }
      }
      else if (iVar10 == 0x71) {
        if ((long)(sats_00->_sats).
                  super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(sats_00->_sats).
                  super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != -0xf8) {
          uVar16 = 0;
          do {
            free_item(local_6d8[uVar16]);
            uVar16 = uVar16 + 1;
          } while (uVar16 < ((long)(sats_00->_sats).
                                   super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(sats_00->_sats).
                                   super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x1084210842108421 + 1U);
        }
        operator_delete__(local_6d8);
        puVar11 = local_6e0;
        lVar15 = *local_6e0 * 0x20;
        uVar16 = lVar15 + 8;
        uVar21 = *local_6e0;
        while (uVar21 != 0) {
          plVar19 = (long *)((long)puVar11 + lVar15 + -8);
          plVar4 = *(long **)((long)puVar11 + lVar15 + -0x18);
          if (plVar19 != plVar4) {
            operator_delete(plVar4,*plVar19 + 1);
          }
          lVar15 = lVar15 + -0x20;
          uVar21 = lVar15;
        }
        operator_delete__(local_6e0,uVar16);
        delwin(win);
        del_panel(local_3a0);
        del_panel(local_698);
        if (local_360 != local_350) {
          operator_delete(local_360,local_350[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        return;
      }
    }
    else {
      if (iVar10 < 0x152) {
        uVar14 = 0x203;
        if (iVar10 != 0x102) {
          if (iVar10 != 0x103) goto LAB_0010cd02;
          uVar14 = 0x202;
        }
      }
      else if (iVar10 == 0x152) {
        uVar14 = 0x206;
      }
      else {
        if (iVar10 != 0x153) goto LAB_0010cd02;
        uVar14 = 0x207;
      }
      menu_driver(local_690,uVar14);
    }
LAB_0010cd02:
    update_panels();
    doupdate();
  } while( true );
}

Assistant:

void DisplayNCurses::render(SatLookAngles &sats) {
#if HAVE_GUI
  // Build the menu and have a place to store the strings.
  auto items = new ITEM *[sats.size() + 1]();
  auto itemStrs = new std::string[sats.size()];
  items[sats.size()] = nullptr;

  // Column names.
  std::stringstream ss;
  ss << std::left << std::setw(10) << "ID" << std::setw(25) << "NAME"
     << std::setw(15) << "AZIMUTH(deg)" << std::setw(15) << "ELEVATION(deg)"
     << std::setw(12) << "RANGE(KM)";
  std::string colNames = ss.str();

  // Create a window to decorate the menu with.
  const int rows = std::max(LINES, 25);
  const int cols = std::max(COLS, 80);
  auto win = newwin(rows, cols, 0, 0);
  box(win, '|', '=');

  // Create another window to hold selected information.
  auto infoWin = newwin(20, 79, (rows / 2) - 12, (cols / 2) - 39);
  wattron(infoWin, A_REVERSE);
  box(infoWin, '|', '-');
  wattroff(infoWin, A_REVERSE);

  // Create panels.
  auto infoPanel = new_panel(infoWin);
  auto mainPanel = new_panel(win);
  bool showInfo = false;

  // Populate menu ('false' avoids calculating new look angles);
  MENU *menu = updateMenu(nullptr, win, sats, items, itemStrs, false);

  // Add title and column names.
  mvwprintw(win, 0, (cols / 2 - 12), "%s", "}-- satnow " VER " --{");
  mvwprintw(win, 1, 3, "%s", colNames.c_str());

  // Print a legend at the bottom.
  mvwhline(win, rows - 3, 1, '-', cols - 2);
  mvwprintw(win, rows - 2, 1, "%s",
            "[Quit: (q)] [Update: (space)] "
            "[Movement: (pg)up/(pg)down] [Details: (d)]");

  // Display.
  update_panels();
  doupdate();
  const int msecs = (_refreshSecs < 0) ? -1 : _refreshSecs;
  timeout(msecs);
  int c;
  while ((c = getch()) != 'q') {
    switch (c) {
    case KEY_DOWN:
      menu_driver(menu, REQ_DOWN_ITEM);
      break;
    case KEY_UP:
      menu_driver(menu, REQ_UP_ITEM);
      break;
    case KEY_NPAGE:
      menu_driver(menu, REQ_SCR_DPAGE);
      break;
    case KEY_PPAGE:
      menu_driver(menu, REQ_SCR_UPAGE);
      break;
    case 'd':
      showInfo = showInfo ^ true;
      // Swap the main and info panel.
      if (showInfo) {
        const ITEM *ci = current_item(menu);
        updateInfoWindow(infoWin, sats[item_index(ci)]);
        show_panel(infoPanel);
        top_panel(infoPanel);
      } else
        hide_panel(infoPanel);
      break;
    case ' ':
    case ERR:
      updateMenu(menu, win, sats, items, itemStrs, true);
      refresh();
      break;
    }
    update_panels();
    doupdate();
  }

  // Cleanup.
  for (size_t i = 0; i < sats.size() + 1; ++i)
    free_item(items[i]);
  delete[] items;
  delete[] itemStrs;
  delwin(win);
  del_panel(mainPanel);
  del_panel(infoPanel);
#endif // HAVE_GUI
}